

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O2

UBool ucnv_outputOverflowToUnicode
                (UConverter *cnv,UChar **target,UChar *targetLimit,int32_t **pOffsets,
                UErrorCode *err)

{
  UChar *pUVar1;
  char cVar2;
  int32_t *piVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  UChar *pUVar7;
  
  lVar6 = 0;
  if (pOffsets == (int32_t **)0x0) {
    piVar3 = (int32_t *)0x0;
  }
  else {
    piVar3 = *pOffsets;
  }
  pUVar7 = *target;
  cVar2 = cnv->UCharErrorBufferLength;
  iVar5 = 0;
  if ('\0' < cVar2) {
    iVar5 = (int)cVar2;
  }
  while( true ) {
    if (iVar5 == lVar6) {
      cnv->UCharErrorBufferLength = '\0';
      *target = pUVar7;
      if (piVar3 != (int32_t *)0x0) {
        *pOffsets = piVar3;
      }
      return '\0';
    }
    if (pUVar7 == targetLimit) break;
    *pUVar7 = cnv->UCharErrorBuffer[lVar6];
    if (piVar3 == (int32_t *)0x0) {
      piVar3 = (int32_t *)0x0;
    }
    else {
      *piVar3 = -1;
      piVar3 = piVar3 + 1;
    }
    pUVar7 = pUVar7 + 1;
    lVar6 = lVar6 + 1;
  }
  lVar4 = 0;
  do {
    pUVar1 = cnv->UCharErrorBuffer + lVar6;
    lVar6 = lVar6 + 1;
    cnv->UCharErrorBuffer[lVar4] = *pUVar1;
    lVar4 = lVar4 + 1;
  } while (lVar6 < cVar2);
  cnv->UCharErrorBufferLength = (int8_t)lVar4;
  *target = pUVar7;
  if (piVar3 != (int32_t *)0x0) {
    *pOffsets = piVar3;
  }
  *err = U_BUFFER_OVERFLOW_ERROR;
  return '\x01';
}

Assistant:

static UBool
ucnv_outputOverflowToUnicode(UConverter *cnv,
                             UChar **target, const UChar *targetLimit,
                             int32_t **pOffsets,
                             UErrorCode *err) {
    int32_t *offsets;
    UChar *overflow, *t;
    int32_t i, length;

    t=*target;
    if(pOffsets!=NULL) {
        offsets=*pOffsets;
    } else {
        offsets=NULL;
    }

    overflow=cnv->UCharErrorBuffer;
    length=cnv->UCharErrorBufferLength;
    i=0;
    while(i<length) {
        if(t==targetLimit) {
            /* the overflow buffer contains too much, keep the rest */
            int32_t j=0;

            do {
                overflow[j++]=overflow[i++];
            } while(i<length);

            cnv->UCharErrorBufferLength=(int8_t)j;
            *target=t;
            if(offsets!=NULL) {
                *pOffsets=offsets;
            }
            *err=U_BUFFER_OVERFLOW_ERROR;
            return TRUE;
        }

        /* copy the overflow contents to the target */
        *t++=overflow[i++];
        if(offsets!=NULL) {
            *offsets++=-1; /* no source index available for old output */
        }
    }

    /* the overflow buffer is completely copied to the target */
    cnv->UCharErrorBufferLength=0;
    *target=t;
    if(offsets!=NULL) {
        *pOffsets=offsets;
    }
    return FALSE;
}